

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::AnyMetadata::PackFrom
          (AnyMetadata *this,Message *message,string *type_url_prefix)

{
  int iVar1;
  undefined4 extraout_var;
  string *output;
  stringpiece_ssize_type in_R9;
  StringPiece type_url_prefix_00;
  undefined1 local_78 [16];
  StringPiece local_68;
  string local_58;
  UrlType *local_38;
  
  local_38 = this->type_url_;
  InitProtobufDefaults();
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x13])(message);
  StringPiece::StringPiece<std::allocator<char>>
            ((StringPiece *)local_78,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (CONCAT44(extraout_var,iVar1) + 8));
  StringPiece::StringPiece<std::allocator<char>>(&local_68,type_url_prefix);
  type_url_prefix_00.length_ = in_R9;
  type_url_prefix_00.ptr_ = (char *)local_68.length_;
  GetTypeUrl_abi_cxx11_
            (&local_58,(internal *)local_78._0_8_,stack0xffffffffffffff90,type_url_prefix_00);
  ArenaStringPtr::SetNoArena(local_38,(string *)&fixed_address_empty_string_abi_cxx11_,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  output = ArenaStringPtr::MutableNoArena
                     (this->value_,(string *)&fixed_address_empty_string_abi_cxx11_);
  MessageLite::SerializeToString(&message->super_MessageLite,output);
  return;
}

Assistant:

void AnyMetadata::PackFrom(const Message& message,
                           const std::string& type_url_prefix) {
  type_url_->SetNoArena(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString(),
      GetTypeUrl(message.GetDescriptor()->full_name(), type_url_prefix));
  message.SerializeToString(value_->MutableNoArena(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited()));
}